

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerHLSL::read_access_chain_array
          (CompilerHLSL *this,string *lhs,SPIRAccessChain *chain)

{
  AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *pAVar1;
  uint uVar2;
  pointer pcVar3;
  uint32_t uVar4;
  SPIRType *pSVar5;
  char (*in_R8) [6];
  string *ts_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  string local_118;
  string ident;
  SPIRAccessChain subchain;
  
  pSVar5 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      *(uint *)&(chain->super_IVariant).field_0xc);
  uVar4 = this->unique_identifier_count;
  this->unique_identifier_count = uVar4 + 1;
  subchain.super_IVariant._vptr_IVariant =
       (_func_int **)CONCAT44(subchain.super_IVariant._vptr_IVariant._4_4_,uVar4);
  join<char_const(&)[2],unsigned_int,char_const(&)[6]>
            (&ident,(spirv_cross *)0x2efe70,(char (*) [2])&subchain,(uint *)"ident",in_R8);
  CompilerGLSL::statement<char_const(&)[9]>(&this->super_CompilerGLSL,(char (*) [9])"[unroll]");
  CompilerGLSL::to_array_size_abi_cxx11_
            ((string *)&subchain,&this->super_CompilerGLSL,pSVar5,
             (int)(pSVar5->array).super_VectorView<unsigned_int>.buffer_size - 1);
  CompilerGLSL::
  statement<char_const(&)[10],std::__cxx11::string&,char_const(&)[7],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[4]>
            (&this->super_CompilerGLSL,(char (*) [10])"for (int ",&ident,(char (*) [7])" = 0; ",
             &ident,(char (*) [4])" < ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&subchain,
             (char (*) [3])0x2f019f,&ident,(char (*) [4])0x30fdf0);
  if (subchain.super_IVariant._vptr_IVariant != (_func_int **)&subchain.storage) {
    operator_delete(subchain.super_IVariant._vptr_IVariant);
  }
  CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
  subchain.super_IVariant.self.id = (chain->super_IVariant).self.id;
  subchain.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRAccessChain_003a2ff8;
  subchain._12_8_ = *(undefined8 *)&(chain->super_IVariant).field_0xc;
  subchain.base._M_dataplus._M_p = (pointer)&subchain.base.field_2;
  pcVar3 = (chain->base)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&subchain.base,pcVar3,pcVar3 + (chain->base)._M_string_length);
  subchain.dynamic_index._M_dataplus._M_p = (pointer)&subchain.dynamic_index.field_2;
  pcVar3 = (chain->dynamic_index)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&subchain.dynamic_index,pcVar3,
             pcVar3 + (chain->dynamic_index)._M_string_length);
  ts_3 = &chain->dynamic_index;
  subchain.row_major_matrix = chain->row_major_matrix;
  subchain.immutable = chain->immutable;
  subchain.static_index = chain->static_index;
  subchain.loaded_from.id = (chain->loaded_from).id;
  subchain.matrix_stride = chain->matrix_stride;
  subchain.array_stride = chain->array_stride;
  pAVar1 = &subchain.implied_read_expressions.stack_storage;
  subchain.implied_read_expressions.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
  buffer_size = 0;
  subchain.implied_read_expressions.buffer_capacity = 8;
  subchain.implied_read_expressions.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
  ptr = (TypedID<(spirv_cross::Types)0> *)pAVar1;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::operator=
            (&subchain.implied_read_expressions,&chain->implied_read_expressions);
  join<std::__cxx11::string&,char_const(&)[4],unsigned_int_const&,char_const(&)[4],std::__cxx11::string_const&>
            (&local_118,(spirv_cross *)&ident,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x300008,
             (char (*) [4])&chain->array_stride,(uint *)0x2f7c8e,(char (*) [4])ts_3,
             in_stack_fffffffffffffed8);
  ::std::__cxx11::string::operator=((string *)&subchain.dynamic_index,(string *)&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  uVar2 = (pSVar5->parent_type).id;
  subchain.super_IVariant._12_4_ = uVar2;
  pSVar5 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr + uVar2);
  if ((pSVar5->array).super_VectorView<unsigned_int>.buffer_size != 0) {
    uVar4 = Compiler::get_decoration
                      ((Compiler *)this,(ID)subchain.super_IVariant._12_4_,DecorationArrayStride);
    subchain.array_stride = uVar4;
  }
  join<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
            (&local_118,(spirv_cross *)lhs,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2e4336,
             (char (*) [2])&ident,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2ef80f,
             (char (*) [2])ts_3);
  read_access_chain(this,(string *)0x0,&local_118,&subchain);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  CompilerGLSL::end_scope(&this->super_CompilerGLSL);
  subchain.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRAccessChain_003a2ff8;
  subchain.implied_read_expressions.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
  buffer_size = 0;
  if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *)
      subchain.implied_read_expressions.
      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr != pAVar1) {
    free(subchain.implied_read_expressions.
         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)subchain.dynamic_index._M_dataplus._M_p != &subchain.dynamic_index.field_2) {
    operator_delete(subchain.dynamic_index._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)subchain.base._M_dataplus._M_p != &subchain.base.field_2) {
    operator_delete(subchain.base._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ident._M_dataplus._M_p != &ident.field_2) {
    operator_delete(ident._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerHLSL::read_access_chain_array(const string &lhs, const SPIRAccessChain &chain)
{
	auto &type = get<SPIRType>(chain.basetype);

	// Need to use a reserved identifier here since it might shadow an identifier in the access chain input or other loops.
	auto ident = get_unique_identifier();

	statement("[unroll]");
	statement("for (int ", ident, " = 0; ", ident, " < ", to_array_size(type, uint32_t(type.array.size() - 1)), "; ",
	          ident, "++)");
	begin_scope();
	auto subchain = chain;
	subchain.dynamic_index = join(ident, " * ", chain.array_stride, " + ", chain.dynamic_index);
	subchain.basetype = type.parent_type;
	if (!get<SPIRType>(subchain.basetype).array.empty())
		subchain.array_stride = get_decoration(subchain.basetype, DecorationArrayStride);
	read_access_chain(nullptr, join(lhs, "[", ident, "]"), subchain);
	end_scope();
}